

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebmlmaster.c
# Opt level: O0

ebml_element *
EBML_MasterFindNextElt
          (ebml_master *Element,ebml_element *Current,bool_t bCreateIfNull,bool_t SetDefault,
          int ForProfile)

{
  ebml_master *local_40;
  ebml_element *i;
  int ForProfile_local;
  bool_t SetDefault_local;
  bool_t bCreateIfNull_local;
  ebml_element *Current_local;
  ebml_master *Element_local;
  
  if (Current == (ebml_element *)0x0) {
    Element_local = (ebml_master *)0x0;
  }
  else {
    if (Current == (ebml_element *)(Current->Base).Next) {
      __assert_fail("(nodetree*)(Current) != ((nodetree*)(Current))->Next",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlmaster.c"
                    ,0x48,
                    "ebml_element *EBML_MasterFindNextElt(ebml_master *, const ebml_element *, bool_t, bool_t, int)"
                   );
    }
    local_40 = (ebml_master *)(Current->Base).Next;
    while ((local_40 != (ebml_master *)0x0 &&
           (((local_40->Base).Context)->Id != Current->Context->Id))) {
      if (local_40 == (ebml_master *)(local_40->Base).Base.Next) {
        __assert_fail("(nodetree*)(i) != ((nodetree*)(i))->Next",
                      "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlmaster.c"
                      ,0x48,
                      "ebml_element *EBML_MasterFindNextElt(ebml_master *, const ebml_element *, bool_t, bool_t, int)"
                     );
      }
      local_40 = (ebml_master *)(local_40->Base).Base.Next;
    }
    if ((local_40 == (ebml_master *)0x0) && (bCreateIfNull != 0)) {
      local_40 = (ebml_master *)EBML_MasterAddElt(Element,Current->Context,SetDefault,ForProfile);
    }
    Element_local = local_40;
  }
  return &Element_local->Base;
}

Assistant:

ebml_element *EBML_MasterFindNextElt(ebml_master *Element, const ebml_element *Current, bool_t bCreateIfNull, bool_t SetDefault, int ForProfile)
{
    ebml_element *i;
    if (!Current)
        return NULL;

    for (i=EBML_MasterNext(Current);i;i=EBML_MasterNext(i))
    {
        if (i->Context->Id == Current->Context->Id)
            break;
    }

    if (!i && bCreateIfNull)
        i = EBML_MasterAddElt(Element,Current->Context,SetDefault, ForProfile);

    return i;
}